

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_6976df::CCoinsViewTest::GetCoin
          (CCoinsViewTest *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  uint64_t uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::find(&(this->map_)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->map_)._M_t._M_impl.super__Rb_tree_header) {
LAB_003342b5:
    bVar2 = false;
  }
  else {
    (coin->out).nValue = (CAmount)cVar3._M_node[2]._M_parent;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(coin->out).scriptPubKey.super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&cVar3._M_node[2]._M_left);
    *(undefined4 *)&coin->field_0x28 = *(undefined4 *)&cVar3._M_node[3]._M_left;
    if ((coin->out).nValue == -1) {
      uVar4 = RandomMixin<FastRandomContext>::randbits<1>
                        (&this->m_rng->super_RandomMixin<FastRandomContext>);
      if (uVar4 == 0) goto LAB_003342b5;
    }
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] bool GetCoin(const COutPoint& outpoint, Coin& coin) const override
    {
        std::map<COutPoint, Coin>::const_iterator it = map_.find(outpoint);
        if (it == map_.end()) {
            return false;
        }
        coin = it->second;
        if (coin.IsSpent() && m_rng.randbool() == 0) {
            // Randomly return false in case of an empty entry.
            return false;
        }
        return true;
    }